

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::HDWallet::HDWallet
          (HDWallet *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool use_ideographic_space)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  size_t sVar3;
  CfdException *this_00;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,"");
  ByteData::ByteData(&this->seed_,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  WallyUtil::ConvertMnemonicToSeed((ByteData *)&local_48,mnemonic,passphrase,use_ideographic_space);
  puVar2 = (this->seed_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->seed_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._M_dataplus._M_p;
  (this->seed_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._M_string_length;
  (this->seed_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_48.field_2._M_allocated_capacity;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  local_48.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_48._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  sVar3 = ByteData::GetDataSize(&this->seed_);
  if (sVar3 != 0x10) {
    sVar3 = ByteData::GetDataSize(&this->seed_);
    if (sVar3 != 0x20) {
      sVar3 = ByteData::GetDataSize(&this->seed_);
      if (sVar3 != 0x40) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_48._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Seed length error.","");
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

HDWallet::HDWallet(
    std::vector<std::string> mnemonic, std::string passphrase,
    bool use_ideographic_space)
    : seed_(ByteData(kEmptySeedStr)) {
  seed_ = ConvertMnemonicToSeed(mnemonic, passphrase, use_ideographic_space);
  if ((seed_.GetDataSize() != HDWallet::kSeed128Size) &&
      (seed_.GetDataSize() != HDWallet::kSeed256Size) &&
      (seed_.GetDataSize() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Seed length error.");
  }
}